

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiView.cpp
# Opt level: O1

string * Imf_3_4::channelInOtherView
                   (string *__return_storage_ptr__,string *channelName,ChannelList *channelList,
                   StringVector *multiView,string *otherViewName)

{
  _Base_ptr __s;
  int iVar1;
  const_iterator cVar2;
  ConstIterator CVar3;
  bool bVar4;
  allocator<char> local_b2;
  allocator<char> local_b1;
  string *local_b0;
  string *local_a8;
  string local_a0;
  string *local_80;
  ChannelList *local_78;
  string local_70;
  string local_50;
  
  local_b0 = __return_storage_ptr__;
  local_a8 = otherViewName;
  local_80 = channelName;
  cVar2._M_node = (_Base_ptr)ChannelList::begin(channelList);
  local_78 = channelList;
  do {
    CVar3 = ChannelList::end(local_78);
    if ((const_iterator)cVar2._M_node == CVar3._i._M_node) {
LAB_0019301a:
      (local_b0->_M_dataplus)._M_p = (pointer)&local_b0->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"");
      return local_b0;
    }
    __s = cVar2._M_node + 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,(char *)__s,&local_b1);
    viewFromChannelName(&local_a0,&local_50,multiView);
    if (local_a0._M_string_length == local_a8->_M_string_length) {
      if (local_a0._M_string_length == 0) {
        bVar4 = true;
      }
      else {
        iVar1 = bcmp(local_a0._M_dataplus._M_p,(local_a8->_M_dataplus)._M_p,
                     local_a0._M_string_length);
        bVar4 = iVar1 == 0;
      }
    }
    else {
      bVar4 = false;
    }
    if (bVar4) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,(char *)__s,&local_b2);
      bVar4 = areCounterparts(&local_70,local_80,multiView);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      bVar4 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (bVar4 != false) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_b0,(char *)__s,(allocator<char> *)&local_a0);
      if ((const_iterator)cVar2._M_node != CVar3._i._M_node) {
        return local_b0;
      }
      goto LAB_0019301a;
    }
    cVar2._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar2._M_node);
  } while( true );
}

Assistant:

string
channelInOtherView (
    const string&       channelName,
    const ChannelList&  channelList,
    const StringVector& multiView,
    const string&       otherViewName)
{
    //
    // Given the name of a channel in one view, return the
    // corresponding channel name for view otherViewName.
    //

    for (ChannelList::ConstIterator i = channelList.begin ();
         i != channelList.end ();
         ++i)
    {
        if (viewFromChannelName (i.name (), multiView) == otherViewName &&
            areCounterparts (i.name (), channelName, multiView))
        {
            return i.name ();
        }
    }

    return "";
}